

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
iterate(TestStatus *__return_storage_ptr__,
       DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkOffset3D offset_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  qpTestResult code;
  VkQueue pVVar4;
  bool bVar5;
  VkResult VVar6;
  TestContext *this_00;
  TestLog *log_00;
  DeviceInterface *vk_00;
  VkDevice device;
  MovePtr *this_01;
  VkPhysicalDeviceFeatures *__src;
  Buffer *this_02;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)18> *pHVar8;
  size_type sVar9;
  Handle<(vk::HandleType)8> *pHVar10;
  Allocation *pAVar11;
  VkDeviceMemory VVar12;
  VkDeviceSize VVar13;
  void *dst;
  reference src;
  pointer pVVar14;
  pointer pPVar15;
  Image *this_03;
  Allocator *allocator_00;
  char *__s;
  Move<vk::VkCommandBuffer_s_*> *this_04;
  undefined4 uVar16;
  undefined4 uVar17;
  allocator<char> local_459;
  string local_458;
  ConstPixelBufferAccess local_438;
  qpTestResult local_40c;
  void *pvStack_408;
  qpTestResult res;
  deInt32 local_400;
  undefined1 local_3f8 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_398;
  const_iterator vertex;
  const_iterator lastIt;
  __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_380;
  __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
  local_378;
  const_iterator firstIt;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  __normal_iterator<vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_338;
  __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
  local_330;
  const_iterator it;
  PixelBufferAccess local_318;
  TextureFormat local_2f0;
  undefined1 local_2e8 [8];
  TextureLevel refImage;
  undefined8 uStack_2b8;
  VkSubmitInfo submitInfo;
  uint local_25c;
  deUint32 offset;
  deUint32 cmdIdx;
  VkMemoryRequirements local_230;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_218;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_208;
  Move<vk::Handle<(vk::HandleType)8>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_1d8;
  undefined1 local_1b8 [8];
  VkBufferCreateInfo indirectCreateInfo;
  VkDeviceSize indirectInfoSize;
  undefined1 local_168 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indirectAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> indirectBuffer;
  deUint64 local_130;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkPhysicalDeviceFeatures features;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  Allocator *allocator;
  VkDevice vkDevice;
  DeviceInterface *vk;
  TestLog *log;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_local;
  
  this_00 = Context::getTestContext((this->super_DrawTestInstanceBase).super_TestInstance.m_context)
  ;
  log_00 = tcu::TestContext::getLog(this_00);
  vk_00 = Context::getDeviceInterface
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  device = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  this_01 = (MovePtr *)
            Context::getDefaultAllocator
                      ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  register0x00000000 =
       Context::getUniversalQueue((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  features.variableMultisampleRate =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  __src = Context::getDeviceFeatures
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  memcpy(&vertexBufferOffset,__src,0xdc);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBuffer.m_internal = 0;
  this_02 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DrawTestInstanceBase).m_vertexBuffer);
  local_130 = (deUint64)Draw::Buffer::object(this_02);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  this_04 = &(this->super_DrawTestInstanceBase).m_cmdBuffer;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,*ppVVar7,0,1,&local_130,&vertexBuffer);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_04->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DrawTestInstanceBase).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar8->m_internal);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168);
  sVar9 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::size
                    (&(this->m_data).commands);
  indirectCreateInfo._16_8_ = sVar9 << 4;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  indirectCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  indirectCreateInfo._4_4_ = 0;
  indirectCreateInfo.pNext._0_4_ = 0;
  indirectCreateInfo.size._0_4_ = 0x100;
  indirectCreateInfo.size._4_4_ = 0;
  indirectCreateInfo.usage = 1;
  indirectCreateInfo._40_8_ = &features.variableMultisampleRate;
  indirectCreateInfo.pQueueFamilyIndices = (deUint32 *)indirectCreateInfo._16_8_;
  ::vk::createBuffer(&local_1f8,vk_00,device,(VkBufferCreateInfo *)local_1b8,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
  uVar16 = SUB84(local_1d8.deleter.m_deviceIface,0);
  uVar17 = (undefined4)((ulong)local_1d8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_deviceIface._0_4_ = uVar16;
  data_00.object.m_internal = local_1d8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = uVar17;
  data_00.deleter.m_device._0_4_ = (int)local_1d8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_1d8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_1d8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_1f8);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &indirectAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  ::vk::getBufferMemoryRequirements(&local_230,vk_00,device,(VkBuffer)pHVar10->m_internal);
  (*(*(_func_int ***)this_01)[3])
            (&local_218,this_01,&local_230,(ulong)::vk::MemoryRequirement::HostVisible);
  local_208 = de::details::MovePtr::operator_cast_to_PtrData(&local_218,this_01);
  data._8_4_ = uVar16;
  data.ptr = (Allocation *)local_1d8.object.m_internal;
  data._12_4_ = uVar17;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_218);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &indirectAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  dVar3 = pHVar10->m_internal;
  pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168)
  ;
  VVar12 = ::vk::Allocation::getMemory(pAVar11);
  pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168)
  ;
  VVar13 = ::vk::Allocation::getOffset(pAVar11);
  VVar6 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar3,VVar12.m_internal,VVar13);
  ::vk::checkResult(VVar6,
                    "vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x388);
  pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168)
  ;
  dst = ::vk::Allocation::getHostPtr(pAVar11);
  src = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::
        operator[](&(this->m_data).commands,0);
  ::deMemcpy(dst,src,(size_t)indirectCreateInfo.pQueueFamilyIndices);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168)
  ;
  VVar12 = ::vk::Allocation::getMemory(pAVar11);
  pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168)
  ;
  VVar13 = ::vk::Allocation::getOffset(pAVar11);
  ::vk::flushMappedMemoryRange
            (pDVar1,device,VVar12,VVar13,(VkDeviceSize)indirectCreateInfo.pQueueFamilyIndices);
  sVar9 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::size
                    (&(this->m_data).commands);
  if ((sVar9 < 2) || (features.dualSrcBlend != 0)) {
    pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                         &indirectAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
    submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar10->m_internal;
    pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_168);
    VVar13 = ::vk::Allocation::getOffset(pAVar11);
    sVar9 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::size
                      (&(this->m_data).commands);
    (*pDVar1->_vptr_DeviceInterface[0x5b])
              (pDVar1,pVVar2,submitInfo.pSignalSemaphores,VVar13,sVar9 & 0xffffffff,0x10);
  }
  else {
    for (local_25c = 0;
        sVar9 = std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::
                size(&(this->m_data).commands), local_25c < sVar9; local_25c = local_25c + 1) {
      pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
                operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                           local_168);
      VVar13 = ::vk::Allocation::getOffset(pAVar11);
      pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
      ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                          (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar2 = *ppVVar7;
      pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                           &indirectAlloc.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.field_0x8);
      (*pDVar1->_vptr_DeviceInterface[0x5b])
                (pDVar1,pVVar2,pHVar10->m_internal,(ulong)((int)VVar13 + local_25c * 0x10),1,0x10);
    }
  }
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar7);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar7);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_2b8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->super_DrawTestInstanceBase).m_cmdBuffer.
                   super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar4 = stack0xffffffffffffffc0;
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)&refImage.m_data.m_cap,0);
  VVar6 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,pVVar4,1,&uStack_2b8,refImage.m_data.m_cap);
  ::vk::checkResult(VVar6,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3ac);
  local_2f0 = ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_2e8,&local_2f0,0x100,0x100,1);
  tcu::TextureLevel::getAccess(&local_318,(TextureLevel *)local_2e8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&it,0.0,0.0,0.0,1.0);
  tcu::clear(&local_318,(Vec4 *)&it);
  local_338._M_current =
       (VkDrawIndirectCommand *)
       std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::begin
                 (&(this->m_data).commands);
  __gnu_cxx::
  __normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
  ::__normal_iterator<vk::VkDrawIndirectCommand*>
            ((__normal_iterator<vk::VkDrawIndirectCommand_const*,std::vector<vk::VkDrawIndirectCommand,std::allocator<vk::VkDrawIndirectCommand>>>
              *)&local_330,&local_338);
  while( true ) {
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                  ::end(&(this->m_data).commands);
    bVar5 = __gnu_cxx::operator!=
                      (&local_330,
                       (__normal_iterator<vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
                        *)&vertices.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar5) break;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&firstIt);
    lastIt._M_current =
         (PositionColorVertex *)
         std::
         vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
         begin((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                *)&this->m_data);
    pVVar14 = __gnu_cxx::
              __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
              ::operator->(&local_330);
    local_380 = __gnu_cxx::
                __normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                ::operator+((__normal_iterator<vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                             *)&lastIt,(ulong)pVVar14->firstVertex);
    __gnu_cxx::
    __normal_iterator<vkt::Draw::PositionColorVertex_const*,std::vector<vkt::Draw::PositionColorVertex,std::allocator<vkt::Draw::PositionColorVertex>>>
    ::__normal_iterator<vkt::Draw::PositionColorVertex*>
              ((__normal_iterator<vkt::Draw::PositionColorVertex_const*,std::vector<vkt::Draw::PositionColorVertex,std::allocator<vkt::Draw::PositionColorVertex>>>
                *)&local_378,&local_380);
    pVVar14 = __gnu_cxx::
              __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
              ::operator->(&local_330);
    vertex._M_current =
         (PositionColorVertex *)
         __gnu_cxx::
         __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
         ::operator+(&local_378,(ulong)pVVar14->vertexCount);
    local_398._M_current = local_378._M_current;
    while (bVar5 = __gnu_cxx::operator!=(&local_398,&vertex), bVar5) {
      pPVar15 = __gnu_cxx::
                __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                ::operator->(&local_398);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&pPVar15->position);
      pPVar15 = __gnu_cxx::
                __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
                ::operator->(&local_398);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&firstIt,
                 &pPVar15->color);
      __gnu_cxx::
      __normal_iterator<const_vkt::Draw::PositionColorVertex_*,_std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>_>
      ::operator++(&local_398);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&zeroOffset.z,(TextureLevel *)local_2e8);
    DrawTestInstanceBase::generateRefImage
              (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&zeroOffset.z,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&firstIt);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&firstIt);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_vk::VkDrawIndirectCommand_*,_std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>_>
    ::operator++(&local_330);
  }
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  VVar6 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,stack0xffffffffffffffc0);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3c2);
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_03 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DrawTestInstanceBase).m_colorTargetImage);
  pVVar4 = stack0xffffffffffffffc0;
  allocator_00 = Context::getDefaultAllocator
                           ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  local_400 = zeroOffset.x;
  pvStack_408 = renderedFrame.m_data;
  offset_00.z = zeroOffset.x;
  offset_00._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_3f8,this_03,pVVar4,allocator_00,VK_IMAGE_LAYOUT_GENERAL
             ,offset_00,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_40c = QP_TEST_RESULT_PASS;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_438,(TextureLevel *)local_2e8);
  bVar5 = imageCompare(log_00,&local_438,(ConstPixelBufferAccess *)local_3f8,
                       (this->m_data).super_DrawParamsBase.topology);
  if (((bVar5 ^ 0xffU) & 1) != 0) {
    local_40c = QP_TEST_RESULT_FAIL;
  }
  code = local_40c;
  __s = qpGetTestResultName(local_40c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,__s,&local_459);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2e8);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_168);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndirectParams>::iterate (void)
{
	tcu::TestLog						&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&			vk					= m_context.getDeviceInterface();
	const vk::VkDevice					vkDevice			= m_context.getDevice();
	vk::Allocator&						allocator			= m_context.getDefaultAllocator();
	const vk::VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32						queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkPhysicalDeviceFeatures	features			= m_context.getDeviceFeatures();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	vk::Move<vk::VkBuffer>		indirectBuffer;
	de::MovePtr<vk::Allocation>	indirectAlloc;

	{
		const vk::VkDeviceSize	indirectInfoSize	= m_data.commands.size() * sizeof(vk::VkDrawIndirectCommand);

		const vk::VkBufferCreateInfo	indirectCreateInfo =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			indirectInfoSize,							// VkDeviceSize			size;
			vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT,	// VkBufferUsageFlags	usage;
			vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		indirectBuffer	= createBuffer(vk, vkDevice, &indirectCreateInfo);
		indirectAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indirectBuffer), vk::MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset()));

		deMemcpy(indirectAlloc->getHostPtr(), &(m_data.commands[0]), (size_t)indirectInfoSize);

		vk::flushMappedMemoryRange(m_vk, vkDevice, indirectAlloc->getMemory(), indirectAlloc->getOffset(), indirectInfoSize);
	}

	// If multiDrawIndirect not supported execute single calls
	if (m_data.commands.size() > 1 && !(features.multiDrawIndirect))
	{
		for (deUint32 cmdIdx = 0; cmdIdx < m_data.commands.size(); ++cmdIdx)
		{
			const deUint32	offset	= (deUint32)(indirectAlloc->getOffset() + cmdIdx * sizeof(vk::VkDrawIndirectCommand));
			m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, offset, 1, sizeof(vk::VkDrawIndirectCommand));
		}
	}
	else
	{
		m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, indirectAlloc->getOffset(), (deUint32)m_data.commands.size(), sizeof(vk::VkDrawIndirectCommand));
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<tcu::Vec4>	vertices;
		std::vector<tcu::Vec4>	colors;

		std::vector<PositionColorVertex>::const_iterator	firstIt	= m_data.vertices.begin() + it->firstVertex;
		std::vector<PositionColorVertex>::const_iterator	lastIt	= firstIt + it->vertexCount;

		for (std::vector<PositionColorVertex>::const_iterator vertex = firstIt; vertex != lastIt; ++vertex)
		{
			vertices.push_back(vertex->position);
			colors.push_back(vertex->color);
		}
		generateRefImage(refImage.getAccess(), vertices, colors);
	}

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}